

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cc
# Opt level: O2

t_object * xemmai::t_module::f_instantiate(wstring_view a_name)

{
  pthread_mutex_t *__mutex;
  long lVar1;
  wchar_t *pwVar2;
  wstring_view a_path;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> __x;
  wstring_view a_path_00;
  bool bVar3;
  pthread_mutex_t *__mutex_00;
  const_iterator cVar4;
  t_object *ptVar5;
  anon_union_8_2_8dc3d723_for_t_value<xemmai::t_slot>_2 *paVar6;
  wchar_t *extraout_RDX;
  wchar_t *in_RSI;
  t_module *in_RDI;
  _Rb_tree<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_xemmai::t_slot>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_xemmai::t_slot>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_xemmai::t_slot>_>_>
  *__const_this;
  vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
  *in_R8;
  anon_union_8_2_8dc3d723_for_t_value<xemmai::t_slot>_2 aVar7;
  t_object *unaff_R13;
  long in_FS_OFFSET;
  wstring_view a_message;
  __type_identity_t<basic_string_view<wchar_t,_char_traits<wchar_t>_>_> __y;
  wstring_view a_path_01;
  wstring_view a_name_00;
  wstring_view a_path_02;
  wstring_view a_name_01;
  wstring path;
  t_value<xemmai::t_pointer> x;
  t_value<xemmai::t_pointer> n;
  t_module *ptVar8;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_b8;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_98;
  t_object *local_78;
  t_value<xemmai::t_slot> local_70;
  t_value<xemmai::t_slot> local_60;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_50;
  
  lVar1 = *(long *)(in_FS_OFFSET + -0x60);
  __mutex_00 = (pthread_mutex_t *)
               t_lock_with_safe_region<std::recursive_mutex>::f_lock
                         ((recursive_mutex *)(lVar1 + 0x410));
  __mutex = (pthread_mutex_t *)(lVar1 + 0x170);
  std::mutex::lock((mutex *)&__mutex->__data);
  cVar4 = std::
          _Rb_tree<std::__cxx11::wstring,std::pair<std::__cxx11::wstring_const,xemmai::t_slot>,std::_Select1st<std::pair<std::__cxx11::wstring_const,xemmai::t_slot>>,std::less<void>,std::allocator<std::pair<std::__cxx11::wstring_const,xemmai::t_slot>>>
          ::_M_lower_bound_tr<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>,void>
                    ((_Rb_tree<std::__cxx11::wstring,std::pair<std::__cxx11::wstring_const,xemmai::t_slot>,std::_Select1st<std::pair<std::__cxx11::wstring_const,xemmai::t_slot>>,std::less<void>,std::allocator<std::pair<std::__cxx11::wstring_const,xemmai::t_slot>>>
                      *)(lVar1 + 0x3e0),
                     (basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)
                     &stack0xffffffffffffff38);
  if ((cVar4._M_node == (_Base_ptr)(lVar1 + 1000)) ||
     (__x._M_str = in_RSI, __x._M_len = (size_t)in_RDI,
     __y._M_str = *(wchar_t **)(cVar4._M_node + 1), __y._M_len = (size_t)cVar4._M_node[1]._M_parent,
     bVar3 = std::operator==(__x,__y), !bVar3)) {
    pthread_mutex_unlock(__mutex);
    local_78 = (t_object *)
               (*(long *)(lVar1 + 0x4a0) +
               *(long *)(*(long *)(*(long *)(lVar1 + 0x4a0) + 0x40) + 0x30));
    t_value<xemmai::t_slot>::f_invoke<>
              (&local_60,local_78,*(size_t **)(*(long *)(in_FS_OFFSET + -0x78) + 0x2e0));
    f_check<unsigned_long>((t_object *)local_60.super_t_slot.v_p._M_b._M_p,L"size");
    aVar7.v_integer = 0;
    do {
      paVar6 = (anon_union_8_2_8dc3d723_for_t_value<xemmai::t_slot>_2 *)
               ((long)local_60.super_t_slot.v_p._M_b._M_p + 0x48);
      if ((ulong)local_60.super_t_slot.v_p._M_b._M_p < (__pointer_type)0x5) {
        paVar6 = &local_60.field_0;
      }
      if ((ulong)*paVar6 <= (ulong)aVar7) {
        std::__cxx11::wstring::
        wstring<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>,void>
                  ((wstring *)&local_50,
                   (basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)
                   &stack0xffffffffffffff38,(allocator<wchar_t> *)&local_70);
        std::operator+(&local_98,L"module \"",&local_50);
        std::operator+(&local_b8,&local_98,L"\" not found.");
        a_message._M_str = local_b8._M_dataplus._M_p;
        a_message._M_len = local_b8._M_string_length;
        f_throw(a_message);
      }
      local_b8._M_dataplus._M_p = (wchar_t *)0x3;
      local_b8._M_string_length = (size_type)aVar7;
      t_value<xemmai::t_slot>::f_get_at(&local_70,(t_pvalue *)local_78);
      f_check<xemmai::t_string>((t_object *)local_70.super_t_slot.v_p._M_b._M_p,L"path");
      a_path_01._M_str = (char *)((long)local_70.super_t_slot.v_p._M_b._M_p + 0x50);
      a_path_01._M_len = *(size_t *)((long)local_70.super_t_slot.v_p._M_b._M_p + 0x48);
      portable::t_path::t_path((t_path *)&local_50,a_path_01);
      a_path_00._M_str = in_RSI;
      a_path_00._M_len = (size_t)in_RDI;
      portable::t_path::operator/((t_path *)&local_98,(t_path *)&local_50,a_path_00);
      std::__cxx11::wstring::wstring((wstring *)&local_b8,&local_98);
      std::__cxx11::wstring::~wstring((wstring *)&local_98);
      std::__cxx11::wstring::~wstring((wstring *)&local_50);
      std::operator+(&local_98,&local_b8,L".xm");
      a_path._M_str = (wchar_t *)in_RDI;
      a_path._M_len = (size_t)__mutex_00;
      ptVar5 = f_load_script(a_path);
      std::__cxx11::wstring::~wstring((wstring *)&local_98);
      if (ptVar5 == (t_object *)0x0) {
        a_path_02._M_str = extraout_RDX;
        a_path_02._M_len = (size_t)local_b8._M_dataplus._M_p;
        ptVar5 = f_load_library((t_module *)local_b8._M_string_length,a_path_02);
        if (ptVar5 != (t_object *)0x0) {
          ptVar8 = in_RDI;
          (**(code **)(*(long *)ptVar5->v_data + 0x18))((t_object *)&local_98,ptVar5->v_data);
          a_name_01._M_str = (wchar_t *)ptVar5;
          a_name_01._M_len = (size_t)in_RSI;
          unaff_R13 = f_new(in_RDI,a_name_01,(t_object *)&local_98,in_R8);
          goto LAB_001450dc;
        }
        bVar3 = true;
      }
      else {
        pwVar2 = *(wchar_t **)ptVar5->v_data;
        ptVar8 = in_RDI;
        f_execute_script((vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
                          *)&local_98,ptVar5);
        a_name_00._M_str = pwVar2;
        a_name_00._M_len = (size_t)in_RSI;
        unaff_R13 = f_new(in_RDI,a_name_00,(t_object *)&local_98,in_R8);
LAB_001450dc:
        std::
        vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
        ::~vector((vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
                   *)&local_98);
        bVar3 = false;
        in_RDI = ptVar8;
      }
      std::__cxx11::wstring::~wstring((wstring *)&local_b8);
      aVar7.v_integer = aVar7.v_integer + 1;
    } while (bVar3);
  }
  else {
    *(undefined1 *)(*(long *)(cVar4._M_node + 2) + 0x19) = 1;
    pthread_mutex_unlock(__mutex);
    unaff_R13 = *(t_object **)(cVar4._M_node + 2);
  }
  pthread_mutex_unlock(__mutex_00);
  return unaff_R13;
}

Assistant:

t_object* t_module::f_instantiate(std::wstring_view a_name)
{
	auto engine = f_engine();
	t_lock_with_safe_region lock(engine->v_module__instantiate__mutex);
	engine->v_object__reviving__mutex.lock();
	{
		auto& instances = engine->v_module__instances;
		auto i = instances.lower_bound(a_name);
		if (i != instances.end() && i->first == a_name) {
			i->second->v_reviving = true;
			engine->v_object__reviving__mutex.unlock();
			return i->second;
		}
	}
	engine->v_object__reviving__mutex.unlock();
	auto& paths = engine->f_module_system()->f_fields()[/*path*/0];
	static size_t index;
	auto n = paths.f_invoke(f_global()->f_symbol_size(), index);
	f_check<size_t>(n, L"size");
	for (size_t i = 0; i < f_as<size_t>(n); ++i) {
		auto x = paths.f_get_at(i);
		f_check<t_string>(x, L"path");
		std::wstring path = portable::t_path(x->f_as<t_string>()) / a_name;
		if (auto code = f_load_script(path + L".xm")) return f_new(a_name, code->f_as<t_code>().v_module, f_execute_script(code));
		if (auto body = f_load_library(path)) return f_new(a_name, body, body->f_as<t_library>().f_define());
	}
	f_throw(L"module \"" + std::wstring(a_name) + L"\" not found.");
}